

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed.c
# Opt level: O2

int equal_feeds(feed_t *a,feed_t *b)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (a->agency_count != b->agency_count) {
    return 0;
  }
  if (a->calendar_dates_count != b->calendar_dates_count) {
    return 0;
  }
  if (a->calendar_records_count != b->calendar_records_count) {
    return 0;
  }
  if (a->fare_attributes_count != b->fare_attributes_count) {
    return 0;
  }
  if (a->fare_rules_count != b->fare_rules_count) {
    return 0;
  }
  if (a->feed_info_count != b->feed_info_count) {
    return 0;
  }
  if (a->frequencies_count != b->frequencies_count) {
    return 0;
  }
  if (a->levels_count != b->levels_count) {
    return 0;
  }
  if (a->pathways_count != b->pathways_count) {
    return 0;
  }
  if (a->routes_count != b->routes_count) {
    return 0;
  }
  if (a->shapes_count != b->shapes_count) {
    return 0;
  }
  if (a->stop_times_count != b->stop_times_count) {
    return 0;
  }
  if (a->stops_count != b->stops_count) {
    return 0;
  }
  if (a->transfers_count != b->transfers_count) {
    return 0;
  }
  if (a->trips_count != b->trips_count) {
    return 0;
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->agency_count) {
    iVar1 = equal_agency((agency_t *)(a->agencies->id + lVar3),(agency_t *)(b->agencies->id + lVar3)
                        );
    lVar3 = lVar3 + 0x280;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->calendar_dates_count) {
    iVar1 = equal_calendar_date((calendar_date_t *)(a->calendar_dates->service_id + lVar3),
                                (calendar_date_t *)(b->calendar_dates->service_id + lVar3));
    lVar3 = lVar3 + 0x50;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->calendar_records_count) {
    iVar1 = equal_calendar_record
                      ((calendar_record_t *)(a->calendar_records->service_id + lVar3),
                       (calendar_record_t *)(b->calendar_records->service_id + lVar3));
    lVar3 = lVar3 + 0x70;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->fare_attributes_count) {
    iVar1 = equal_fare_attributes
                      ((fare_attributes_t *)(a->fare_attributes->fare_id + lVar3),
                       (fare_attributes_t *)(b->fare_attributes->fare_id + lVar3));
    lVar3 = lVar3 + 0xa0;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->fare_rules_count) {
    iVar1 = equal_fare_rule((fare_rule_t *)(a->fare_rules->fare_id + lVar3),
                            (fare_rule_t *)(b->fare_rules->fare_id + lVar3));
    lVar3 = lVar3 + 0x140;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->feed_info_count) {
    iVar1 = equal_feed_info((feed_info_t *)(a->feed_info->feed_publisher_name + lVar3),
                            (feed_info_t *)(b->feed_info->feed_publisher_name + lVar3));
    lVar3 = lVar3 + 0x212;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->frequencies_count) {
    iVar1 = equal_frequency((frequency_t *)(a->frequencies->trip_id + lVar3),
                            (frequency_t *)(b->frequencies->trip_id + lVar3));
    lVar3 = lVar3 + 0x5c;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->levels_count) {
    iVar1 = equal_level((level_t *)(a->levels->id + lVar3),(level_t *)(b->levels->id + lVar3));
    lVar3 = lVar3 + 0x88;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->pathways_count) {
    iVar1 = equal_pathway((pathway_t *)(a->pathways->id + lVar3),
                          (pathway_t *)(b->pathways->id + lVar3));
    lVar3 = lVar3 + 0x1e8;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->routes_count) {
    iVar1 = equal_route((route_t *)(a->routes->id + lVar3),(route_t *)(b->routes->id + lVar3));
    lVar3 = lVar3 + 0x2d8;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->shapes_count) {
    iVar1 = equal_shape((shape_t *)(a->shapes->id + lVar3),(shape_t *)(b->shapes->id + lVar3));
    lVar3 = lVar3 + 0x70;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->stop_times_count) {
    iVar1 = equal_stop_time((stop_time_t *)(a->stop_times->trip_id + lVar3),
                            (stop_time_t *)(b->stop_times->trip_id + lVar3));
    lVar3 = lVar3 + 0xf0;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->stops_count) {
    iVar1 = equal_stop((stop_t *)(a->stops->id + lVar3),(stop_t *)(b->stops->id + lVar3));
    lVar3 = lVar3 + 0x3b0;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < a->transfers_count) {
    iVar1 = equal_transfer((transfer_t *)(a->transfers->from_stop_id + lVar3),
                           (transfer_t *)(b->transfers->from_stop_id + lVar3));
    lVar3 = lVar3 + 0x88;
    if (iVar1 == 0) {
      return 0;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  do {
    iVar1 = a->trips_count;
    lVar4 = lVar4 + 1;
    if (iVar1 <= lVar4) break;
    iVar2 = equal_trip((trip_t *)(a->trips->route_id + lVar3),(trip_t *)(b->trips->route_id + lVar3)
                      );
    lVar3 = lVar3 + 0x1cc;
  } while (iVar2 != 0);
  return (uint)(iVar1 <= lVar4);
}

Assistant:

int equal_feeds(const feed_t *a, const feed_t *b) {
    if (a->agency_count != b->agency_count)
        return 0;

    if (a->calendar_dates_count != b->calendar_dates_count)
        return 0;

    if (a->calendar_records_count != b->calendar_records_count)
        return 0;

    if (a->fare_attributes_count != b->fare_attributes_count)
        return 0;

    if (a->fare_rules_count != b->fare_rules_count)
        return 0;

    if (a->feed_info_count != b->feed_info_count)
        return 0;

    if (a->frequencies_count != b->frequencies_count)
        return 0;

    if (a->levels_count != b->levels_count)
        return 0;

    if (a->pathways_count != b->pathways_count)
        return 0;

    if (a->routes_count != b->routes_count)
        return 0;

    if (a->shapes_count != b->shapes_count)
        return 0;

    if (a->stop_times_count != b->stop_times_count)
        return 0;

    if (a->stops_count != b->stops_count)
        return 0;

    if (a->transfers_count != b->transfers_count)
        return 0;

    if (a->trips_count != b->trips_count)
        return 0;


    for (int i = 0; i < a->agency_count; i++)
        if (!equal_agency(&(a->agencies[i]), &(b->agencies[i])))
            return 0;

    for (int i = 0; i < a->calendar_dates_count; i++)
        if (!equal_calendar_date(&(a->calendar_dates[i]), &(b->calendar_dates[i])))
            return 0;

    for (int i = 0; i < a->calendar_records_count; i++)
        if (!equal_calendar_record(&(a->calendar_records[i]), &(b->calendar_records[i])))
            return 0;

    for (int i = 0; i < a->fare_attributes_count; i++)
        if (!equal_fare_attributes(&(a->fare_attributes[i]), &(b->fare_attributes[i])))
            return 0;

    for (int i = 0; i < a->fare_rules_count; i++)
        if (!equal_fare_rule(&(a->fare_rules[i]), &(b->fare_rules[i])))
            return 0;

    for (int i = 0; i < a->feed_info_count; i++)
        if (!equal_feed_info(&(a->feed_info[i]), &(b->feed_info[i])))
            return 0;

    for (int i = 0; i < a->frequencies_count; i++)
        if (!equal_frequency(&(a->frequencies[i]), &(b->frequencies[i])))
            return 0;

    for (int i = 0; i < a->levels_count; i++)
        if (!equal_level(&(a->levels[i]), &(b->levels[i])))
            return 0;

    for (int i = 0; i < a->pathways_count; i++)
        if (!equal_pathway(&(a->pathways[i]), &(b->pathways[i])))
            return 0;

    for (int i = 0; i < a->routes_count; i++)
        if (!equal_route(&(a->routes[i]), &(b->routes[i])))
            return 0;

    for (int i = 0; i < a->shapes_count; i++)
        if (!equal_shape(&(a->shapes[i]), &(b->shapes[i])))
            return 0;

    for (int i = 0; i < a->stop_times_count; i++)
        if (!equal_stop_time(&(a->stop_times[i]), &(b->stop_times[i])))
            return 0;

    for (int i = 0; i < a->stops_count; i++)
        if (!equal_stop(&(a->stops[i]), &(b->stops[i])))
            return 0;

    for (int i = 0; i < a->transfers_count; i++)
        if (!equal_transfer(&(a->transfers[i]), &(b->transfers[i])))
            return 0;

    for (int i = 0; i < a->trips_count; i++)
        if (!equal_trip(&(a->trips[i]), &(b->trips[i])))
            return 0;

    return 1;
}